

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O1

void trace_genrec_(Integer *ga,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,Integer *op)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  Integer *pIVar4;
  long *plVar5;
  FILE *__stream;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int ndim;
  int tmp_dims [2];
  int block [2];
  int dims [2];
  int type;
  int hi [2];
  int lo [2];
  char fname [15];
  int local_c0;
  uint local_bc;
  int aiStack_b8 [2];
  int *local_b0;
  long *local_a8;
  FILE *local_a0;
  uint auStack_98 [4];
  int *local_88;
  Integer *local_80;
  Integer *local_78;
  Integer *local_70;
  Integer *local_68;
  Integer *local_60;
  int local_54;
  int local_50 [4];
  char local_3f [15];
  
  local_a8 = ga;
  local_60 = ilo;
  iVar6 = GA_Nodeid();
  local_bc = GA_Nnodes();
  plVar5 = local_a8;
  if (MAX_EVENTS <= current) {
    return;
  }
  if (iVar6 == 0) {
    lVar10 = (long)ganum;
    if (0 < lVar10) {
      lVar9 = 0;
      bVar3 = false;
      do {
        if (*local_a8 == (long)galog[lVar9]) {
          bVar3 = true;
        }
        lVar9 = lVar9 + 1;
      } while (lVar10 != lVar9);
      if (bVar3) goto LAB_0017387c;
    }
    ganum = ganum + 1;
    galog[lVar10] = (int)*local_a8;
    sprintf(local_3f,"distrib.%d");
    local_a0 = fopen(local_3f,"w");
    NGA_Inquire((int)*plVar5,&local_54,&local_c0,(int *)(auStack_98 + 2));
    lVar10 = (long)(int)local_bc;
    local_88 = (int *)malloc(lVar10 * 4);
    if (local_88 == (int *)0x0) {
      GA_Error("malloc failed for proclist",0);
    }
    local_68 = op;
    local_b0 = (int *)malloc(lVar10 << 4);
    if (local_b0 == (int *)0x0) {
      GA_Error("malloc failed for regions",0);
    }
    uVar11 = local_bc;
    lVar10 = (long)local_c0;
    uVar7 = (ulong)local_bc;
    if (0 < lVar10) {
      lVar9 = 0;
      memset(local_50 + 2,0,lVar10 * 4);
      do {
        local_50[lVar9] = auStack_98[lVar9 + 2] - 1;
        lVar9 = lVar9 + 1;
      } while (lVar10 != lVar9);
    }
    local_70 = jhi;
    iVar6 = NGA_Locate_region((int)*local_a8,local_50 + 2,local_50,local_b0,local_88);
    if (iVar6 < 1) {
      GA_Error("error in NGA_Locate_region",iVar6);
    }
    __stream = local_a0;
    if (0 < (long)local_c0) {
      piVar8 = local_b0 + 2;
      lVar10 = 0;
      do {
        aiStack_b8[lVar10] = 0;
        auStack_98[lVar10] = 0;
        if (0 < (int)uVar11) {
          iVar6 = aiStack_b8[lVar10];
          lVar9 = 0;
          do {
            iVar1 = *(int *)((long)piVar8 + lVar9);
            if (iVar6 < iVar1) {
              auStack_98[lVar10] = auStack_98[lVar10] + 1;
              iVar6 = iVar1;
            }
            lVar9 = lVar9 + 0x10;
          } while (uVar7 << 4 != lVar9);
          aiStack_b8[lVar10] = iVar6;
        }
        lVar10 = lVar10 + 1;
        piVar8 = piVar8 + 1;
      } while (lVar10 != local_c0);
    }
    local_80 = ihi;
    local_78 = jlo;
    fprintf(__stream,"%d\n",(ulong)uVar11);
    if (0 < local_c0) {
      lVar10 = 0;
      do {
        fprintf(__stream,"%d ",(ulong)auStack_98[lVar10 + 2]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_c0);
    }
    fputc(10,__stream);
    if (0 < local_c0) {
      lVar10 = 0;
      do {
        uVar11 = auStack_98[lVar10] - 1;
        if (auStack_98[lVar10] == 1) {
          uVar11 = 1;
        }
        fprintf(__stream,"%d ",(ulong)uVar11);
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_c0);
    }
    fputc(10,__stream);
    if (0 < local_c0) {
      piVar8 = local_b0 + 2;
      lVar10 = 0;
      uVar11 = local_bc;
      do {
        uVar2 = auStack_98[lVar10];
        if (uVar2 == 1) {
          fprintf(local_a0,"%d\n",(ulong)auStack_98[lVar10 + 2]);
        }
        else {
          aiStack_b8[lVar10] = 0;
          if (0 < (int)uVar11) {
            iVar6 = aiStack_b8[lVar10];
            lVar9 = 0;
            uVar11 = 0;
            do {
              if (iVar6 < *(int *)((long)piVar8 + lVar9)) {
                uVar11 = uVar11 + 1;
                if (uVar11 == uVar2) break;
                fprintf(local_a0,"%d\n",(ulong)(*(int *)((long)piVar8 + lVar9) + 1));
                iVar6 = *(int *)((long)piVar8 + lVar9);
              }
              lVar9 = lVar9 + 0x10;
            } while (uVar7 << 4 != lVar9);
            aiStack_b8[lVar10] = iVar6;
            uVar11 = local_bc;
          }
        }
        lVar10 = lVar10 + 1;
        piVar8 = piVar8 + 1;
      } while (lVar10 < local_c0);
    }
    fclose(local_a0);
    free(local_b0);
    free(local_88);
    op = local_68;
    ihi = local_80;
    jhi = local_70;
    jlo = local_78;
  }
LAB_0017387c:
  pIVar4 = tlog;
  uVar7 = (ulong)(tt0 * 1000000.0);
  tlog[current * 2] = (long)uVar7 >> 0x3f & (long)(tt0 * 1000000.0 - 9.223372036854776e+18) | uVar7;
  uVar7 = (ulong)(tt1 * 1000000.0);
  pIVar4[current * 2 + 1] =
       (long)uVar7 >> 0x3f & (long)(tt1 * 1000000.0 - 9.223372036854776e+18) | uVar7;
  pIVar4 = indlog;
  indlog[current * 6] = *local_a8;
  pIVar4[current * 6 + 1] = *local_60;
  pIVar4[current * 6 + 2] = *ihi;
  pIVar4[current * 6 + 3] = *jlo;
  pIVar4[current * 6 + 4] = *jhi;
  pIVar4[current * 6 + 5] = *op;
  current = current + 1;
  return;
}

Assistant:

void trace_genrec_(Integer *ga, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi,
                   Integer *op)
{
    int i, d, has_record, counter;
    FILE *fout;
    char fname[15];
    typedef struct {
       int lo[2];
       int hi[2];
    } patch_t;
    patch_t *regions;
    int *proclist;
    int ndim, dims[2], tmp_dims[2], lo[2], hi[2], type, block[2];
    int me=GA_Nodeid(), nproc=GA_Nnodes(), proc;
    
    if(current >=  MAX_EVENTS) return;

    /* only node 0 does the bookkeeping */
    if(me == 0) {
        /* test if this ga has been recorded */
        has_record = 0;
        for(i=0; i<ganum; i++)
            if(*ga == (long) galog[i]) has_record = 1;

        if(!has_record) {
            galog[ganum++] = (int)*ga;
            
            sprintf(fname, "distrib.%d",(int) *ga);
            fout = fopen(fname,"w");
            
            NGA_Inquire((int)*ga, &type, &ndim, dims);
            
            /* get memory for arrays describing distribution */
            proclist = (int*)malloc(nproc*sizeof(int));
            if(!proclist)GA_Error("malloc failed for proclist",0);
            regions = (patch_t*)malloc(nproc*sizeof(patch_t));
            if(!regions)GA_Error("malloc failed for regions",0);

            for(d=0; d<ndim; d++) { lo[d] = 0; hi[d] = dims[d] -1;}

            proc = NGA_Locate_region((int)*ga, lo, hi, (int*)regions, proclist);
            if(proc<1) GA_Error("error in NGA_Locate_region",proc);
            
            for(d=0; d<ndim; d++) {
                tmp_dims[d] = 0; block[d] = 0;
                for(i=0; i<nproc; i++)
                    if(regions[i].hi[d] > tmp_dims[d]) {
                        block[d]++;
                        tmp_dims[d] = regions[i].hi[d];
                    }
            }

            /* print the number of processed */
            fprintf(fout, "%d\n", nproc);
            /* print dimensions */
            for(d=0; d<ndim; d++) fprintf(fout, "%d ", dims[d]);
            fprintf(fout, "\n");

            /* print number of lines to draw for each dimension */
            for(d=0; d<ndim; d++) 
                if(block[d] == 1) fprintf(fout, "%d ", block[d]);
                else fprintf(fout, "%d ", block[d]-1);
            fprintf(fout, "\n");

            /* print the offset for each line */
            for(d=0; d<ndim; d++) {
                if(block[d] == 1) fprintf(fout, "%d\n", dims[d]);
                else {
                    tmp_dims[d] = 0;
                    counter = 0;
                    for(i=0; i<nproc; i++)
                        if(regions[i].hi[d] > tmp_dims[d]) {
                            counter++;
                            if(counter == block[d]) break;
                            fprintf(fout, "%d\n",
                                    regions[i].hi[d]+1);
                            tmp_dims[d] = regions[i].hi[d];
                        }
                }
            }
            fclose(fout);
            free(regions); free(proclist);
        }
    }

    tlog[current*2]     = (unsigned long)(tt0 * 1000000);
    tlog[current*2+1]   = (unsigned long)(tt1 * 1000000);
    indlog[current*6]   = *ga;
    indlog[current*6+1] = *ilo;
    indlog[current*6+2] = *ihi;
    indlog[current*6+3] = *jlo;
    indlog[current*6+4] = *jhi;
    indlog[current*6+5] = *op;
    current++;
}